

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall gmath::PinholeCamera::setA(PinholeCamera *this,Matrix33d *AA)

{
  undefined1 auVar1 [16];
  int iVar2;
  SMatrix<double,_3,_3> *pSVar3;
  ostream *out_00;
  IOException *this_00;
  allocator local_1d1;
  char *local_1d0;
  string local_1b0;
  ostringstream out;
  
  pSVar3 = SMatrix<double,_3,_3>::operator=(&this->A,AA);
  auVar1._4_4_ = -(uint)((this->A).v[2][0] != 0.0);
  auVar1._0_4_ = -(uint)((this->A).v[1][0] != 0.0);
  auVar1._8_4_ = -(uint)((this->A).v[2][1] != 0.0);
  auVar1._12_4_ = -(uint)((this->A).v[2][2] != 1.0);
  iVar2 = movmskps((int)pSVar3,auVar1);
  if (iVar2 == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  out_00 = std::operator<<((ostream *)&out,"Invalid camera matrix: ");
  operator<<((basic_ostream<char,_std::char_traits<char>_> *)out_00,&this->A);
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_1b0,local_1d0,&local_1d1);
  gutil::IOException::IOException(this_00,&local_1b0);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PinholeCamera::setA(const Matrix33d &AA)
{
  A=AA;

  if (A(1, 0) != 0 || A(2, 0) != 0 || A(2, 1) != 0 || A(2, 2) != 1)
  {
    std::ostringstream out;
    out << "Invalid camera matrix: " << A;
    throw gutil::IOException(out.str().c_str());
  }
}